

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::to_composite_constructor_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *parent_type,uint32_t id,
          bool block_like_type)

{
  bool bVar1;
  SPIRType *type;
  byte bVar2;
  char (*in_R9) [2];
  bool bVar3;
  SPIRType tmp_type;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  string local_1a0;
  undefined1 local_180 [32];
  uint *local_160;
  size_t local_158;
  uint local_148 [8];
  bool *local_128;
  size_t local_120;
  bool local_110 [24];
  TypedID<(spirv_cross::Types)1> *local_f8;
  size_t local_f0;
  TypedID<(spirv_cross::Types)1> local_e0 [8];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  type = Compiler::expression_type(&this->super_Compiler,id);
  bVar3 = false;
  if ((parent_type->basetype == Struct) && (bVar3 = false, type->basetype == Boolean)) {
    bVar3 = (this->backend).boolean_in_struct_remapped_type != Boolean;
  }
  bVar1 = Compiler::is_array(&this->super_Compiler,type);
  if (bVar1) {
    bVar1 = (this->backend).array_is_value_type;
    bVar2 = (this->backend).array_is_value_type_in_buffer_blocks;
    if (!block_like_type) {
      bVar2 = bVar1;
    }
    if ((~(bVar1 & bVar2) & 1) != 0 || bVar3) {
      to_enclosed_expression_abi_cxx11_((string *)local_180,this,id,true);
      to_rerolled_array_expression(__return_storage_ptr__,this,parent_type,(string *)local_180,type)
      ;
      if ((undefined1 *)local_180._0_8_ == local_180 + 0x10) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_180._0_8_);
      return __return_storage_ptr__;
    }
  }
  to_unpacked_expression_abi_cxx11_(__return_storage_ptr__,this,id,true);
  if (bVar3) {
    SPIRType::SPIRType((SPIRType *)local_180,type);
    local_180._16_4_ = (this->backend).boolean_in_struct_remapped_type;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1c0,this,local_180,0);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
              (&local_1a0,(spirv_cross *)local_1c0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x309149,
               (char (*) [2])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x314a82,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p);
    }
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0]);
    }
    local_180._0_8_ = &PTR__SPIRType_003a8f58;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    local_b8 = 0;
    if (local_c0 != local_a8) {
      free(local_c0);
    }
    local_f0 = 0;
    if (local_f8 != local_e0) {
      free(local_f8);
    }
    local_120 = 0;
    if (local_128 != local_110) {
      free(local_128);
    }
    local_158 = 0;
    if (local_160 != local_148) {
      free(local_160);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_composite_constructor_expression(const SPIRType &parent_type, uint32_t id, bool block_like_type)
{
	auto &type = expression_type(id);

	bool reroll_array = false;
	bool remapped_boolean = parent_type.basetype == SPIRType::Struct &&
	                        type.basetype == SPIRType::Boolean &&
	                        backend.boolean_in_struct_remapped_type != SPIRType::Boolean;

	if (is_array(type))
	{
		reroll_array = !backend.array_is_value_type ||
		               (block_like_type && !backend.array_is_value_type_in_buffer_blocks);

		if (remapped_boolean)
		{
			// Forced to reroll if we have to change bool[] to short[].
			reroll_array = true;
		}
	}

	if (reroll_array)
	{
		// For this case, we need to "re-roll" an array initializer from a temporary.
		// We cannot simply pass the array directly, since it decays to a pointer and it cannot
		// participate in a struct initializer. E.g.
		// float arr[2] = { 1.0, 2.0 };
		// Foo foo = { arr }; must be transformed to
		// Foo foo = { { arr[0], arr[1] } };
		// The array sizes cannot be deduced from specialization constants since we cannot use any loops.

		// We're only triggering one read of the array expression, but this is fine since arrays have to be declared
		// as temporaries anyways.
		return to_rerolled_array_expression(parent_type, to_enclosed_expression(id), type);
	}
	else
	{
		auto expr = to_unpacked_expression(id);
		if (remapped_boolean)
		{
			auto tmp_type = type;
			tmp_type.basetype = backend.boolean_in_struct_remapped_type;
			expr = join(type_to_glsl(tmp_type), "(", expr, ")");
		}

		return expr;
	}
}